

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

Type * __thiscall Typelib::Registry::build(Registry *this,string *name,size_t size)

{
  undefined1 local_50 [40];
  Type *type;
  size_t size_local;
  string *name_local;
  Registry *this_local;
  
  type = (Type *)size;
  size_local = (size_t)name;
  name_local = (string *)this;
  local_50._32_8_ = get(this,name);
  this_local = (Registry *)local_50._32_8_;
  if ((Registry *)local_50._32_8_ == (Registry *)0x0) {
    getFullName((Registry *)local_50,(string *)this);
    this_local = (Registry *)TypeBuilder::build(this,(string *)local_50,(int)type);
    std::__cxx11::string::~string((string *)local_50);
  }
  return (Type *)this_local;
}

Assistant:

const Type* Registry::build(const std::string& name, std::size_t size)
    {
        const Type* type = get(name);
        if (type)
            return type;

        return TypeBuilder::build(*this, getFullName(name), size);
    }